

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

Matrix33d * gmath::createR(Vector3d *n,double phi)

{
  double *pdVar1;
  double dVar2;
  SVector<double,_3> *in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  SMatrix<double,_3,_3> *a;
  SMatrix<double,_3,_3> *this;
  SMatrix<double,_3,_3> *a_00;
  double s;
  double n3;
  double n2;
  double n1;
  Matrix33d m3;
  Matrix33d m2;
  Matrix33d m1;
  double l;
  Matrix33d *R;
  SVector<double,_3> *in_stack_fffffffffffffd10;
  SMatrix<double,_3,_3> local_158;
  double local_110;
  double local_108;
  double local_100;
  SMatrix<double,_3,_3> local_f8;
  SMatrix<double,_3,_3> local_b0;
  SMatrix<double,_3,_3> local_68;
  double local_20;
  double local_18;
  SVector<double,_3> *local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  local_20 = norm<double,3>(in_stack_fffffffffffffd10);
  if (0.0 < local_20) {
    SMatrix<double,_3,_3>::SMatrix(&local_68);
    SMatrix<double,_3,_3>::SMatrix(&local_b0);
    SMatrix<double,_3,_3>::SMatrix(&local_f8);
    local_100 = SVector<double,_3>::operator[](local_10,0);
    local_100 = local_100 / local_20;
    local_108 = SVector<double,_3>::operator[](local_10,1);
    local_108 = local_108 / local_20;
    local_110 = SVector<double,_3>::operator[](local_10,2);
    local_110 = local_110 / local_20;
    dVar3 = local_100 * local_100;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,0,0);
    *pdVar1 = dVar3;
    dVar3 = local_100 * local_108;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,0,1);
    *pdVar1 = dVar3;
    a = (SMatrix<double,_3,_3> *)(local_100 * local_110);
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,0,2);
    *pdVar1 = (double)a;
    this = (SMatrix<double,_3,_3> *)(local_108 * local_100);
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,1,0);
    *pdVar1 = (double)this;
    a_00 = (SMatrix<double,_3,_3> *)(local_108 * local_108);
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,1,1);
    *pdVar1 = (double)a_00;
    s = local_108 * local_110;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,1,2);
    *pdVar1 = s;
    dVar3 = local_110 * local_100;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,2,0);
    *pdVar1 = dVar3;
    dVar3 = local_110 * local_108;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,2,1);
    *pdVar1 = dVar3;
    dVar3 = local_110 * local_110;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_b0,2,2);
    *pdVar1 = dVar3;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,0,0);
    *pdVar1 = 0.0;
    dVar3 = -local_110;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,0,1);
    dVar2 = local_108;
    *pdVar1 = dVar3;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,0,2);
    dVar3 = local_110;
    *pdVar1 = dVar2;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,1,0);
    *pdVar1 = dVar3;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,1,1);
    *pdVar1 = 0.0;
    dVar3 = -local_100;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,1,2);
    *pdVar1 = dVar3;
    dVar2 = -local_108;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,2,0);
    dVar3 = local_100;
    *pdVar1 = dVar2;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,2,1);
    *pdVar1 = dVar3;
    pdVar1 = SMatrix<double,_3,_3>::operator()(&local_f8,2,2);
    *pdVar1 = 0.0;
    cos(local_18);
    operator*(s,a_00);
    cos(local_18);
    operator*(s,a_00);
    SMatrix<double,_3,_3>::operator+(this,a);
    sin(local_18);
    operator*(s,a_00);
    SMatrix<double,_3,_3>::operator+(this,a);
    SMatrix<double,_3,_3>::operator=(in_RDI,&local_158);
  }
  return in_RDI;
}

Assistant:

Matrix33d createR(const Vector3d &n, double phi)
{
  Matrix33d R;

  double l=norm(n);

  if (l > 0)
  {
    Matrix33d m1, m2, m3;

    double n1=n[0]/l;
    double n2=n[1]/l;
    double n3=n[2]/l;

    m2(0, 0)=n1*n1; m2(0, 1)=n1*n2; m2(0, 2)=n1*n3;
    m2(1, 0)=n2*n1; m2(1, 1)=n2*n2; m2(1, 2)=n2*n3;
    m2(2, 0)=n3*n1; m2(2, 1)=n3*n2; m2(2, 2)=n3*n3;

    m3(0, 0)=  0; m3(0, 1)=-n3; m3(0, 2)= n2;
    m3(1, 0)= n3; m3(1, 1)=  0; m3(1, 2)=-n1;
    m3(2, 0)=-n2; m3(2, 1)= n1; m3(2, 2)=  0;

    R=cos(phi)*m1 + (1-cos(phi))*m2 + sin(phi)*m3;
  }

  return R;
}